

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O3

void __thiscall irr::gui::CGUISpriteBank::CGUISpriteBank(CGUISpriteBank *this,IGUIEnvironment *env)

{
  int iVar1;
  undefined4 extraout_var;
  IVideoDriver *pIVar2;
  
  *(undefined8 *)&this->field_0x80 = 0;
  *(undefined4 *)&this->field_0x88 = 1;
  (this->super_IGUISpriteBank)._vptr_IGUISpriteBank = (_func_int **)0x271470;
  *(undefined8 *)&this->field_0x78 = 0x2714f0;
  *(undefined8 *)&(this->super_IGUISpriteBank).field_0x8 = 0;
  *(undefined8 *)&(this->super_IGUISpriteBank).field_0x10 = 0;
  *(undefined8 *)&(this->super_IGUISpriteBank).field_0x18 = 0;
  this->field_0x20 = 1;
  (this->Rectangles).m_data.
  super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Rectangles).m_data.
  super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Rectangles).m_data.
  super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Rectangles).is_sorted = true;
  (this->Textures).m_data.
  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Textures).m_data.
  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Textures).m_data.
  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Textures).is_sorted = true;
  this->Environment = env;
  this->Driver = (IVideoDriver *)0x0;
  if (env != (IGUIEnvironment *)0x0) {
    iVar1 = (*env->_vptr_IGUIEnvironment[6])(env);
    pIVar2 = (IVideoDriver *)CONCAT44(extraout_var,iVar1);
    this->Driver = pIVar2;
    if (pIVar2 != (IVideoDriver *)0x0) {
      *(int *)(&pIVar2->field_0x10 + (long)pIVar2->_vptr_IVideoDriver[-3]) =
           *(int *)(&pIVar2->field_0x10 + (long)pIVar2->_vptr_IVideoDriver[-3]) + 1;
    }
  }
  return;
}

Assistant:

CGUISpriteBank::CGUISpriteBank(IGUIEnvironment *env) :
		Environment(env), Driver(0)
{
#ifdef _DEBUG
	setDebugName("CGUISpriteBank");
#endif

	if (Environment) {
		Driver = Environment->getVideoDriver();
		if (Driver)
			Driver->grab();
	}
}